

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O2

Node<MeshLib::Face> * __thiscall AVL::Node<MeshLib::Face>::balance(Node<MeshLib::Face> *this)

{
  int iVar1;
  Node<MeshLib::Face> *pNVar2;
  
  iVar1 = difference_in_height(this);
  if (0xfffffffc < iVar1 - 2U) {
    compute_height(this);
    return this;
  }
  if (-1 < iVar1) {
    iVar1 = difference_in_height(this->left);
    if (iVar1 < 0) {
      pNVar2 = rotate_left(this->left);
      this->left = pNVar2;
    }
    pNVar2 = rotate_right(this);
    return pNVar2;
  }
  iVar1 = difference_in_height(this->right);
  if (0 < iVar1) {
    pNVar2 = rotate_right(this->right);
    this->right = pNVar2;
  }
  pNVar2 = rotate_left(this);
  return pNVar2;
}

Assistant:

Node<T> * balance ()
    {
        int d = difference_in_height ();

        // only rotate if out of balance
        if (d < -1 || d > 1)
        {
            // too heavy on the right
            if (d < 0)
            {
                // if right child is too heavy on the left,
                // rotate right child to the right
                if (right -> difference_in_height () > 0)
                    right = right -> rotate_right ();

                // rotate current node to the left
                return rotate_left ();
            }
            // too heavy on the left
            else
            {
                // if left child is too heavy on the right,
                // rotate left child to the left
                if (left -> difference_in_height () < 0)
                    left = left -> rotate_left ();

                // rotate current node to the right
                return rotate_right ();
            }
        }

        // recompute the height of each node on the way up
        compute_height ();

        // otherwise, the node is balanced and we simply return it
        return this;
    }